

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O2

TPZTransform<double> *
pztopology::TPZLine::TransformSideToElement(TPZTransform<double> *__return_storage_ptr__,int side)

{
  TPZFNMatrix<3,_double> *this;
  double *pdVar1;
  double dVar2;
  TPZTransform<double> t;
  
  if ((uint)side < 3) {
    TPZTransform<double>::TPZTransform(&t,1,(uint)(side == 2));
    (*t.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(&t.fMult);
    this = &t.fSum;
    (*t.fSum.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(this);
    if (side == 0) {
      pdVar1 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,0);
      dVar2 = -1.0;
    }
    else {
      if (side == 1) {
        pdVar1 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,0);
      }
      else {
        pdVar1 = TPZFMatrix<double>::operator()(&t.fMult.super_TPZFMatrix<double>,0,0);
      }
      dVar2 = 1.0;
    }
    *pdVar1 = dVar2;
    TPZTransform<double>::TPZTransform(__return_storage_ptr__,&t);
    TPZTransform<double>::~TPZTransform(&t);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"TPZLine::TransformSideToElement side out range\n");
    TPZTransform<double>::TPZTransform(__return_storage_ptr__,0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> TPZLine::TransformSideToElement(int side){
		
		if(side<0 || side>2){
			PZError << "TPZLine::TransformSideToElement side out range\n";
			return TPZTransform<>(0,0);
		}
		int sidedim = 1;
		if(side <2) sidedim = 0;
		
		TPZTransform<> t(1,sidedim);
		t.Mult().Zero();
		t.Sum().Zero();
		
		switch(side){
			case 0:
				t.Sum()(0,0) = -1.0;
				return t;
			case 1:
				t.Sum()(0,0) =  1.0;
				return t;
			case 2:
				t.Mult()(0,0) =  1.0;
				return t;
		}
		return TPZTransform<>(0,0);
	}